

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::SplitProgramPath(string *in_name,string *dir,string *file,bool param_4)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  undefined1 local_78 [8];
  string oldDir;
  size_type slashPos;
  bool param_3_local;
  string *file_local;
  string *dir_local;
  string *in_name_local;
  
  std::__cxx11::string::operator=((string *)dir,(string *)in_name);
  std::__cxx11::string::clear();
  ConvertToUnixSlashes(dir);
  bVar2 = FileIsDirectory(dir);
  if (!bVar2) {
    lVar1 = std::__cxx11::string::rfind((char)dir,0x2f);
    if (lVar1 == -1) {
      std::__cxx11::string::operator=((string *)file,(string *)dir);
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::substr((ulong)((long)&oldDir.field_2 + 8),(ulong)dir);
      std::__cxx11::string::operator=((string *)file,(string *)(oldDir.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(oldDir.field_2._M_local_buf + 8));
      std::__cxx11::string::resize((ulong)dir);
    }
  }
  bVar3 = std::__cxx11::string::empty();
  if (((bVar3 & 1) != 0) || (bVar2 = FileIsDirectory(dir), bVar2)) {
    in_name_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::string((string *)local_78,(string *)in_name);
    ConvertToUnixSlashes((string *)local_78);
    std::__cxx11::string::operator=((string *)dir,(string *)in_name);
    in_name_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_78);
  }
  return in_name_local._7_1_;
}

Assistant:

bool SystemTools::SplitProgramPath(const std::string& in_name,
                                   std::string& dir, std::string& file, bool)
{
  dir = in_name;
  file.clear();
  SystemTools::ConvertToUnixSlashes(dir);

  if (!SystemTools::FileIsDirectory(dir)) {
    std::string::size_type slashPos = dir.rfind('/');
    if (slashPos != std::string::npos) {
      file = dir.substr(slashPos + 1);
      dir.resize(slashPos);
    } else {
      file = dir;
      dir.clear();
    }
  }
  if (!(dir.empty()) && !SystemTools::FileIsDirectory(dir)) {
    std::string oldDir = in_name;
    SystemTools::ConvertToUnixSlashes(oldDir);
    dir = in_name;
    return false;
  }
  return true;
}